

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deBlockBuffer.hpp
# Opt level: O3

void __thiscall
de::BlockBuffer<de::BlockBufferBasicTest::Message>::BlockBuffer
          (BlockBuffer<de::BlockBufferBasicTest::Message> *this,int blockSize,int numBlocks)

{
  int iVar1;
  Message *__s;
  int *piVar2;
  deSemaphore dVar3;
  int iVar4;
  ulong uVar5;
  
  this->m_writeBlock = 0;
  this->m_writePos = 0;
  this->m_readBlock = 0;
  this->m_readPos = 0;
  this->m_fill = 0;
  this->m_empty = 0;
  this->m_blockSize = blockSize;
  this->m_numBlocks = numBlocks;
  this->m_elements = (Message *)0x0;
  this->m_numUsedInBlock = (int *)0x0;
  Mutex::Mutex(&this->m_writeLock,0);
  Mutex::Mutex(&this->m_readLock,0);
  this->m_canceled = 0;
  iVar1 = this->m_numBlocks;
  iVar4 = this->m_blockSize * iVar1;
  uVar5 = 0xffffffffffffffff;
  if (-1 < iVar4) {
    uVar5 = (long)iVar4 * 4;
  }
  __s = (Message *)operator_new__(uVar5);
  if (iVar4 != 0) {
    memset(__s,0,(long)iVar4 * 4);
  }
  this->m_elements = __s;
  uVar5 = 0xffffffffffffffff;
  if (-1 < iVar1) {
    uVar5 = (long)iVar1 << 2;
  }
  piVar2 = (int *)operator_new__(uVar5);
  this->m_numUsedInBlock = piVar2;
  dVar3 = deSemaphore_create(0,(deSemaphoreAttributes *)0x0);
  this->m_fill = dVar3;
  dVar3 = deSemaphore_create(numBlocks,(deSemaphoreAttributes *)0x0);
  this->m_empty = dVar3;
  return;
}

Assistant:

BlockBuffer<T>::BlockBuffer (int blockSize, int numBlocks)
	: m_fill			(0)
	, m_empty			(0)
	, m_writeBlock		(0)
	, m_writePos		(0)
	, m_readBlock		(0)
	, m_readPos			(0)
	, m_blockSize		(blockSize)
	, m_numBlocks		(numBlocks)
	, m_elements		(DE_NULL)
	, m_numUsedInBlock	(DE_NULL)
	, m_writeLock		()
	, m_readLock		()
	, m_canceled		(DE_FALSE)
{
	DE_ASSERT(blockSize > 0);
	DE_ASSERT(numBlocks > 0);

	try
	{
		m_elements			= new T[m_numBlocks*m_blockSize];
		m_numUsedInBlock	= new int[m_numBlocks];
	}
	catch (...)
	{
		delete[] m_elements;
		delete[] m_numUsedInBlock;
		throw;
	}

	m_fill	= deSemaphore_create(0, DE_NULL);
	m_empty	= deSemaphore_create(numBlocks, DE_NULL);
	DE_ASSERT(m_fill && m_empty);
}